

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles3::Functional::FragCoordWCase::iterate(FragCoordWCase *this)

{
  RenderContext *pRVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  deUint32 err;
  int iVar5;
  undefined4 extraout_var;
  RenderTarget *pRVar6;
  TestError *this_00;
  int iVar7;
  char *description;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  RGBA threshold;
  Surface refImg;
  Surface testImg;
  deUint16 indices [6];
  float positions [16];
  ProgramSources sources;
  ShaderProgram program;
  RGBA local_2b8;
  RGBA local_2b4;
  Surface local_2b0;
  undefined1 local_298 [8];
  char *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined4 local_270;
  TestLog *local_268;
  Surface local_260;
  TextureFormat local_248;
  long local_240;
  long local_238 [2];
  undefined8 local_228;
  undefined4 local_220;
  value_type local_218;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  undefined1 local_1c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  pointer pbStack_198;
  int local_190;
  value_type *local_188;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  ShaderProgram local_100;
  
  local_268 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = pRVar6->m_width;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = pRVar6->m_height;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar13 = (pRVar6->m_pixelFormat).alphaBits;
  bVar9 = 8 - (char)(pRVar6->m_pixelFormat).redBits;
  uVar4 = 0;
  if (0 < iVar13) {
    uVar4 = 0x1000000 << (8U - (char)iVar13 & 0x1f);
  }
  uVar12 = 0x100 << (8U - (char)(pRVar6->m_pixelFormat).greenBits & 0x1f) | 1 << (bVar9 & 0x1f);
  uVar4 = 0x10000 << (8U - (char)(pRVar6->m_pixelFormat).blueBits & 0x1f) | uVar12 | uVar4;
  uVar11 = 1 << (bVar9 & 0x1f) & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  uVar12 = uVar12 >> 8 & 0xff;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  uVar10 = uVar4 >> 0x10 & 0xff;
  if (0xfd < uVar10) {
    uVar10 = 0xfe;
  }
  uVar4 = uVar4 >> 0x18;
  if (0xfd < uVar4) {
    uVar4 = 0xfe;
  }
  local_2b4.m_value = uVar4 * 0x1000000 + (uVar10 << 0x10 | uVar12 << 8 | uVar11) + 0x1010101;
  tcu::Surface::Surface(&local_260,iVar7,iVar5);
  tcu::Surface::Surface(&local_2b0,iVar7,iVar5);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,"");
  local_298 = (undefined1  [8])&local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,
             "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(0.0, 1.0/gl_FragCoord.w - 1.0, 0.0, 1.0);\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d0,0,0xac);
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = 0;
  local_120._9_7_ = 0;
  local_120[0x10] = 0;
  local_120._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0,&local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8,(value_type *)local_298);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar1,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(local_268,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    local_1d0 = (undefined1  [8])local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Compile failed","");
    tcu::TestError::TestError(this_00,(string *)local_1d0);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1e8 = 0xbf8000003f800000;
  uStack_1e0 = 0x3f80000000000000;
  local_1f8 = 0x3f99999a3f99999a;
  uStack_1f0 = 0x3f99999a00000000;
  local_218.field_2._M_allocated_capacity = 0xc0000000c0000000;
  local_218.field_2._8_8_ = 0x4000000000000000;
  local_218._M_dataplus._M_p = (pointer)0x3fd9999abfd9999a;
  local_218._M_string_length = 0x3fd9999a00000000;
  local_228 = 0x2000200010000;
  local_220 = 0x30001;
  local_248 = (TextureFormat)local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"a_position","");
  local_298._0_4_ = A;
  local_290 = local_288._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,local_248,local_240 + (long)local_248);
  local_270 = 0;
  local_1d0._0_4_ = local_298._0_4_;
  local_1c8._M_p = (pointer)&local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_290,local_290 + local_288._M_allocated_capacity);
  local_1b8.field_2._M_allocated_capacity._0_4_ = local_270;
  local_1b8.field_2._8_8_ = 8;
  pbStack_198 = (pointer)0x400000004;
  local_190 = 0;
  local_188 = &local_218;
  if (local_290 != local_288._M_local_buf + 8) {
    operator_delete(local_290,local_288._8_8_ + 1);
  }
  if (local_248 != (TextureFormat)local_238) {
    operator_delete((void *)local_248,local_238[0] + 1);
  }
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1680))(local_100.m_program.m_program);
  local_298._0_4_ = R;
  local_298._4_4_ = UNORM_INT32;
  local_290 = (char *)CONCAT44(local_290._4_4_,1);
  local_288._M_allocated_capacity = (size_type)&local_228;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
            (VertexArrayBinding *)local_1d0,(PrimitiveList *)local_298,(DrawUtilCallback *)0x0);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_248.order = RGBA;
  local_248.type = UNORM_INT8;
  if ((void *)local_260.m_pixels.m_cap != (void *)0x0) {
    local_260.m_pixels.m_cap = (size_t)local_260.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_298,&local_248,local_260.m_width,local_260.m_height,1,
             (void *)local_260.m_pixels.m_cap);
  glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_298);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                  ,0x1ba);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._M_p !=
      &local_1b8) {
    operator_delete(local_1c8._M_p,(ulong)(local_1b8._M_dataplus._M_p + 1));
  }
  if (0 < local_2b0.m_height) {
    uVar4 = 0;
    iVar7 = local_2b0.m_height;
    iVar5 = local_2b0.m_width;
    do {
      if (0 < iVar5) {
        iVar13 = 0;
        do {
          fVar16 = ((float)iVar13 + 0.5) / (float)iVar5;
          fVar18 = ((float)(int)(local_2b0.m_height + ~uVar4) + 0.5) / (float)local_2b0.m_height;
          fVar17 = 1.0 - fVar16;
          if (1.0 <= fVar16 + fVar18) {
            fVar18 = 1.0 - fVar18;
            fVar19 = (1.0 - fVar17) - fVar18;
            auVar15._0_4_ = fVar18 * 1.2;
            auVar15._4_4_ = fVar18;
            auVar15._8_8_ = 0;
            auVar15 = divps(auVar15,_DAT_01bc1280);
            fVar16 = (fVar17 + fVar17) * 0.5 + fVar19 + auVar15._0_4_;
            fVar18 = fVar17 * 0.5 + fVar19 + auVar15._4_4_;
          }
          else {
            auVar20._0_4_ = (fVar17 - fVar18) * 1.7;
            auVar14._0_4_ = fVar16 * 1.2;
            auVar20._4_4_ = fVar17 - fVar18;
            auVar20._8_8_ = 0;
            auVar20 = divps(auVar20,_DAT_01bc1290);
            auVar14._4_4_ = fVar16;
            auVar14._8_8_ = 0;
            auVar15 = divps(auVar14,_DAT_01bc1280);
            fVar16 = auVar15._0_4_ + (fVar18 + fVar18) * 0.5 + auVar20._0_4_;
            fVar18 = auVar15._4_4_ + fVar18 * 0.5 + auVar20._4_4_;
          }
          local_1d0 = (undefined1  [8])((ulong)(uint)(fVar16 / fVar18 + -1.0) << 0x20);
          local_1c8._M_p = (pointer)0x3f80000000000000;
          tcu::RGBA::RGBA(&local_2b8,(Vec4 *)local_1d0);
          *(deUint32 *)
           ((long)local_2b0.m_pixels.m_ptr + (long)(int)(local_2b0.m_width * uVar4 + iVar13) * 4) =
               local_2b8.m_value;
          iVar13 = iVar13 + 1;
          iVar7 = local_2b0.m_height;
          iVar5 = local_2b0.m_width;
        } while (iVar13 < local_2b0.m_width);
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < iVar7);
  }
  bVar2 = tcu::pixelThresholdCompare
                    (local_268,"Result","Image comparison result",&local_2b0,&local_260,&local_2b4,
                     COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,description
            );
  glu::ShaderProgram::~ShaderProgram(&local_100);
  tcu::Surface::~Surface(&local_2b0);
  tcu::Surface::~Surface(&local_260);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= m_context.getRenderTarget().getWidth();
		const int				height		= m_context.getRenderTarget().getHeight();
		const tcu::RGBA			threshold	= tcu::RGBA(1,1,1,1) + m_context.getRenderTarget().getPixelFormat().getColorThreshold();

		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		const float				w[4]		= { 1.7f, 2.0f, 1.2f, 1.0f };

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = vec4(0.0, 1.0/gl_FragCoord.w - 1.0, 0.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			const float positions[] =
			{
				-w[0],  w[0], 0.0f, w[0],
				-w[1], -w[1], 0.0f, w[1],
				 w[2],  w[2], 0.0f, w[2],
				 w[3], -w[3], 0.0f, w[3]
			};
			const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_position", 4, 4, 0, &positions[0]);

			gl.useProgram(program.getProgram());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));

			glu::readPixels(m_context.getRenderContext(), 0, 0, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		for (int y = 0; y < refImg.getHeight(); y++)
		{
			for (int x = 0; x < refImg.getWidth(); x++)
			{
				const float			xf			= (float(x)+.5f) / float(refImg.getWidth());
				const float			yf			= (float(refImg.getHeight()-y-1)+.5f) / float(refImg.getHeight());
				const float			oow			= ((xf + yf) < 1.0f)
												? projectedTriInterpolate(tcu::Vec3(w[0], w[1], w[2]), tcu::Vec3(w[0], w[1], w[2]), xf, yf)
												: projectedTriInterpolate(tcu::Vec3(w[3], w[2], w[1]), tcu::Vec3(w[3], w[2], w[1]), 1.0f-xf, 1.0f-yf);
				const tcu::Vec4		color		(0.0f, oow - 1.0f, 0.0f, 1.0f);

				refImg.setPixel(x, y, tcu::RGBA(color));
			}
		}

		// Compare
		{
			bool isOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}